

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O0

int mriStep_SetDeltaGammaMax(ARKodeMem ark_mem,sunrealtype dgmax)

{
  ARKodeMem in_XMM0_Qa;
  int retval;
  ARKodeMRIStepMem step_mem;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe0;
  int local_4;
  
  local_4 = mriStep_AccessStepMem
                      (in_XMM0_Qa,in_stack_ffffffffffffffe0,
                       (ARKodeMRIStepMem *)
                       CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (local_4 == 0) {
    if (0.0 < (double)in_XMM0_Qa) {
      *(ARKodeMem *)(in_stack_ffffffffffffffe0 + 200) = in_XMM0_Qa;
    }
    else {
      in_stack_ffffffffffffffe0[200] = -0x66;
      in_stack_ffffffffffffffe0[0xc9] = -0x67;
      in_stack_ffffffffffffffe0[0xca] = -0x67;
      in_stack_ffffffffffffffe0[0xcb] = -0x67;
      in_stack_ffffffffffffffe0[0xcc] = -0x67;
      in_stack_ffffffffffffffe0[0xcd] = -0x67;
      in_stack_ffffffffffffffe0[0xce] = -0x37;
      in_stack_ffffffffffffffe0[0xcf] = '?';
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mriStep_SetDeltaGammaMax(ARKodeMem ark_mem, sunrealtype dgmax)
{
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* if argument legal set it, otherwise set default */
  if (dgmax <= ZERO) { step_mem->dgmax = DGMAX; }
  else { step_mem->dgmax = dgmax; }

  return (ARK_SUCCESS);
}